

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Oscilloscope.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Oscilloscope::ChFunction_Oscilloscope
          (ChFunction_Oscilloscope *this,ChFunction_Oscilloscope *other)

{
  list<double,_std::allocator<double>_> *this_00;
  double dVar1;
  int iVar2;
  
  this_00 = &this->values;
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Oscilloscope_01191238;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<double,_std::allocator<double>_>::operator=(this_00,&other->values);
  dVar1 = other->dx;
  this->end_x = other->end_x;
  this->dx = dVar1;
  iVar2 = other->amount;
  this->max_amount = other->max_amount;
  this->amount = iVar2;
  return;
}

Assistant:

ChFunction_Oscilloscope::ChFunction_Oscilloscope(const ChFunction_Oscilloscope& other) {
    values = other.values;
    dx = other.dx;
    end_x = other.end_x;
    amount = other.amount;
    max_amount = other.max_amount;
}